

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

TextureBindingSp __thiscall
vkt::sr::anon_unknown_0::TextureGather2DArrayInstance::createTexture
          (TextureGather2DArrayInstance *this)

{
  CompareMode compare_;
  WrapMode wrapS_;
  WrapMode wrapT_;
  FilterMode minFilter_;
  FilterMode magFilter_;
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  deUint32 seed;
  TestContext *pTVar5;
  Texture2DArray *pTVar6;
  ConstPixelBufferAccess *pCVar7;
  CommandLine *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar8;
  TextureBinding *this_02;
  SharedPtrStateBase *extraout_RDX;
  long in_RSI;
  TextureBindingSp TVar9;
  Vector<int,_3> local_4b4;
  MessageBuilder local_4a8;
  ConstPixelBufferAccess local_328;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  string local_2c0;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  LogImage local_220;
  int local_18c;
  undefined1 local_188 [4];
  int layerNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  allocator<char> local_141;
  string local_140;
  LogImageSet local_120;
  ConstPixelBufferAccess *local_e0;
  PixelBufferAccess *level;
  int levelNdx;
  int levelEnd;
  int levelBegin;
  undefined1 local_bc [8];
  Sampler sampler;
  undefined1 local_70 [8];
  MovePtr<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> texture;
  TextureFormatInfo texFmtInfo;
  TestLog *log;
  TextureGather2DArrayInstance *this_local;
  
  pTVar5 = Context::getTestContext(*(Context **)(in_RSI + 8));
  texFmtInfo.lookupBias.m_data._8_8_ = tcu::TestContext::getLog(pTVar5);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)
             &texture.
              super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.m_data
              .field_0x8,(TextureFormat *)(in_RSI + 0x218));
  pTVar6 = (Texture2DArray *)operator_new(0x58);
  iVar2 = tcu::Vector<int,_3>::x((Vector<int,_3> *)(in_RSI + 0x264));
  iVar3 = tcu::Vector<int,_3>::y((Vector<int,_3> *)(in_RSI + 0x264));
  iVar4 = tcu::Vector<int,_3>::z((Vector<int,_3> *)(in_RSI + 0x264));
  tcu::Texture2DArray::Texture2DArray(pTVar6,(TextureFormat *)(in_RSI + 0x218),iVar2,iVar3,iVar4);
  de::DefaultDeleter<tcu::Texture2DArray>::DefaultDeleter
            ((DefaultDeleter<tcu::Texture2DArray> *)&sampler.field_0x37);
  de::details::MovePtr<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::MovePtr
            ((MovePtr<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> *)local_70,
             pTVar6);
  compare_ = *(CompareMode *)(in_RSI + 0x220);
  wrapS_ = *(WrapMode *)(in_RSI + 0x224);
  wrapT_ = *(WrapMode *)(in_RSI + 0x228);
  minFilter_ = *(FilterMode *)(in_RSI + 0x240);
  magFilter_ = *(FilterMode *)(in_RSI + 0x244);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&levelEnd,0.0,0.0,0.0,0.0);
  tcu::Sampler::Sampler
            ((Sampler *)local_bc,wrapS_,wrapT_,REPEAT_GL,minFilter_,magFilter_,0.0,true,compare_,0,
             (Vec4 *)&levelEnd,false,MODE_DEPTH);
  levelNdx = *(int *)(in_RSI + 0x248);
  pTVar6 = de::details::UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::
           operator->((UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> *)
                      local_70);
  level._4_4_ = tcu::TextureLevelPyramid::getNumLevels(&pTVar6->super_TextureLevelPyramid);
  for (level._0_4_ = levelNdx; (int)level < level._4_4_; level._0_4_ = (int)level + 1) {
    pTVar6 = de::details::UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>
             ::operator->((UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>
                           *)local_70);
    tcu::Texture2DArray::allocLevel(pTVar6,(int)level);
    pTVar6 = de::details::UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>
             ::operator->((UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>
                           *)local_70);
    pCVar7 = &tcu::TextureLevelPyramid::getLevel(&pTVar6->super_TextureLevelPyramid,(int)level)->
              super_ConstPixelBufferAccess;
    local_e0 = pCVar7;
    pTVar5 = Context::getTestContext(*(Context **)(in_RSI + 8));
    this_00 = tcu::TestContext::getCommandLine(pTVar5);
    seed = tcu::CommandLine::getBaseSeed(this_00);
    fillWithRandomColorTiles
              ((PixelBufferAccess *)pCVar7,
               (Vec4 *)&texture.
                        super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>
                        .m_data.field_0x8,(Vec4 *)(texFmtInfo.valueMin.m_data + 2),seed);
    uVar1 = texFmtInfo.lookupBias.m_data._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"InputTextureLevel",&local_141);
    de::toString<int>((string *)local_188,(int *)&level);
    std::operator+(&local_168,"Input texture, level ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
    tcu::LogImageSet::LogImageSet(&local_120,&local_140,&local_168);
    tcu::TestLog::operator<<((TestLog *)uVar1,&local_120);
    tcu::LogImageSet::~LogImageSet(&local_120);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)local_188);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    local_18c = 0;
    while( true ) {
      iVar2 = local_18c;
      iVar3 = tcu::Vector<int,_3>::z((Vector<int,_3> *)(in_RSI + 0x264));
      uVar1 = texFmtInfo.lookupBias.m_data._8_8_;
      if (iVar3 <= iVar2) break;
      de::toString<int>(&local_2a0,&local_18c);
      std::operator+(&local_280,"InputTextureLevel",&local_2a0);
      std::operator+(&local_260,&local_280,"Layer");
      de::toString<int>(&local_2c0,&local_18c);
      std::operator+(&local_240,&local_260,&local_2c0);
      de::toString<int>(&local_300,&local_18c);
      std::operator+(&local_2e0,"Layer ",&local_300);
      pCVar7 = local_e0;
      iVar2 = local_18c;
      iVar3 = tcu::ConstPixelBufferAccess::getWidth(local_e0);
      iVar4 = tcu::ConstPixelBufferAccess::getHeight(local_e0);
      tcu::getSubregion((PixelBufferAccess *)&local_328,(PixelBufferAccess *)pCVar7,0,0,iVar2,iVar3,
                        iVar4,1);
      tcu::LogImage::LogImage
                (&local_220,&local_240,&local_2e0,&local_328,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::TestLog::operator<<((TestLog *)uVar1,&local_220);
      tcu::LogImage::~LogImage(&local_220);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
      local_18c = local_18c + 1;
    }
    this_01 = tcu::TestLog::operator<<
                        ((TestLog *)texFmtInfo.lookupBias.m_data._8_8_,
                         (EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::TestLog::operator<<(&local_4a8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (&local_4a8,(char (*) [31])"Note: texture level\'s size is ");
    iVar2 = tcu::ConstPixelBufferAccess::getWidth(local_e0);
    iVar3 = tcu::ConstPixelBufferAccess::getHeight(local_e0);
    iVar4 = tcu::ConstPixelBufferAccess::getDepth(local_e0);
    tcu::Vector<int,_3>::Vector(&local_4b4,iVar2,iVar3,iVar4);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_4b4);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4a8);
  }
  pTVar6 = de::details::UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::
           operator*((UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> *)
                     local_70);
  swizzleTexture((Texture2DArray *)(in_RSI + 0x288),pTVar6,(MaybeTextureSwizzle *)(in_RSI + 0x22c));
  this_02 = (TextureBinding *)operator_new(0x68);
  pTVar6 = de::details::MovePtr<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::
           release((MovePtr<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> *)
                   local_70);
  TextureBinding::TextureBinding(this_02,pTVar6,(Sampler *)local_bc);
  de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr
            ((SharedPtr<vkt::sr::TextureBinding> *)this,this_02);
  de::details::MovePtr<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::~MovePtr
            ((MovePtr<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> *)local_70);
  TVar9.m_state = extraout_RDX;
  TVar9.m_ptr = (TextureBinding *)this;
  return TVar9;
}

Assistant:

TextureBindingSp TextureGather2DArrayInstance::createTexture (void)
{
	TestLog&						log			= m_context.getTestContext().getLog();
	const tcu::TextureFormatInfo	texFmtInfo	= tcu::getTextureFormatInfo(m_baseParams.textureFormat);
	MovePtr<tcu::Texture2DArray>	texture		= MovePtr<tcu::Texture2DArray>(new tcu::Texture2DArray(m_baseParams.textureFormat, m_textureSize.x(), m_textureSize.y(), m_textureSize.z()));
	const tcu::Sampler				sampler		(m_baseParams.wrapS, m_baseParams.wrapT, tcu::Sampler::REPEAT_GL,
												 m_baseParams.minFilter, m_baseParams.magFilter,
												 0.0f /* LOD threshold */, true /* normalized coords */, m_baseParams.shadowCompareMode);

	{
		const int	levelBegin	= m_baseParams.baseLevel;
		const int	levelEnd	= texture->getNumLevels();
		DE_ASSERT(m_baseParams.baseLevel < texture->getNumLevels());

		for (int levelNdx = levelBegin; levelNdx < levelEnd; levelNdx++)
		{
			texture->allocLevel(levelNdx);
			const PixelBufferAccess& level = texture->getLevel(levelNdx);
			fillWithRandomColorTiles(level, texFmtInfo.valueMin, texFmtInfo.valueMax, (deUint32)m_context.getTestContext().getCommandLine().getBaseSeed());

			log << TestLog::ImageSet("InputTextureLevel", "Input texture, level " + de::toString(levelNdx));
			for (int layerNdx = 0; layerNdx < m_textureSize.z(); layerNdx++)
				log << TestLog::Image("InputTextureLevel" + de::toString(layerNdx) + "Layer" + de::toString(layerNdx),
									  "Layer " + de::toString(layerNdx),
									  tcu::getSubregion(level, 0, 0, layerNdx, level.getWidth(), level.getHeight(), 1));
			log << TestLog::EndImageSet
				<< TestLog::Message << "Note: texture level's size is " << IVec3(level.getWidth(), level.getHeight(), level.getDepth()) << TestLog::EndMessage;
		}

		swizzleTexture(m_swizzledTexture, *texture, m_baseParams.textureSwizzle);
	}

	return TextureBindingSp(new TextureBinding(texture.release(), sampler));
}